

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

void spvc_msl_vertex_attribute_init(spvc_msl_vertex_attribute *attr)

{
  attr->location = 0;
  attr->format = SPVC_MSL_SHADER_INPUT_FORMAT_OTHER;
  attr->builtin = SpvBuiltInMax;
  return;
}

Assistant:

void spvc_msl_vertex_attribute_init(spvc_msl_vertex_attribute *attr)
{
#if SPIRV_CROSS_C_API_MSL
	// Crude, but works.
	MSLShaderInterfaceVariable attr_default;
	attr->location = attr_default.location;
	attr->format = static_cast<spvc_msl_vertex_format>(attr_default.format);
	attr->builtin = static_cast<SpvBuiltIn>(attr_default.builtin);
#else
	memset(attr, 0, sizeof(*attr));
#endif
}